

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerStElemI
          (Lowerer *this,Instr *instr,PropertyOperationFlags flags,bool isHelper,
          JnHelperMethod helperMethod)

{
  code *pcVar1;
  Instr *instr_00;
  bool bVar2;
  IRType IVar3;
  BailOutKind BVar4;
  int32 iVar5;
  JitProfilingInstr *instr_01;
  undefined4 *puVar6;
  IndirOpnd *pIVar7;
  LabelInstr *target;
  IntConstOpnd *opndArg;
  RegOpnd *opndArg_00;
  JnHelperMethod local_9c;
  JnHelperMethod local_98;
  JnHelperMethod local_94;
  JnHelperMethod local_90;
  JnHelperMethod local_8c;
  Opnd *baseOpnd;
  IntConstType offset;
  Opnd *indexOpnd;
  IndirOpnd *dstIndirOpnd;
  LabelInstr *labelSkipBailOut;
  BailOutKind bailOutKind;
  bool allowConvert;
  IRType srcType;
  Opnd *newDst;
  Opnd *dst;
  Opnd *src1;
  Instr *instrPrev;
  byte local_25;
  JnHelperMethod helperMethod_local;
  bool isHelper_local;
  Instr *pIStack_20;
  PropertyOperationFlags flags_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  src1 = (Opnd *)instr->m_prev;
  instrPrev._4_4_ = helperMethod;
  local_25 = isHelper;
  helperMethod_local = flags;
  pIStack_20 = instr;
  instr_local = (Instr *)this;
  bVar2 = IR::Instr::IsJitProfilingInstr(instr);
  if (bVar2) {
    if ((local_25 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2394,"(!isHelper)","!isHelper");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    instr_01 = IR::Instr::AsJitProfilingInstr(pIStack_20);
    LowerProfiledStElemI(this,instr_01,helperMethod_local);
    this_local = (Lowerer *)src1;
  }
  else {
    dst = IR::Instr::GetSrc1(pIStack_20);
    newDst = IR::Instr::GetDst(pIStack_20);
    _bailOutKind = (RegOpnd *)0x0;
    labelSkipBailOut._7_1_ = IR::Opnd::GetType(dst);
    bVar2 = IR::Opnd::IsIndirOpnd(newDst);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x239e,"(dst->IsIndirOpnd())","Expected indirOpnd on StElementI");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pIVar7 = IR::Opnd::AsIndirOpnd(newDst);
    labelSkipBailOut._6_1_ = IR::IndirOpnd::ConversionAllowed(pIVar7);
    bVar2 = IR::Instr::HasBailOutInfo(pIStack_20);
    if (bVar2) {
      labelSkipBailOut._0_4_ = IR::Instr::GetBailOutKind(pIStack_20);
      BVar4 = IR::operator&((BailOutKind)labelSkipBailOut,BailOutOnInvalidatedArrayHeadSegment);
      if (BVar4 == BailOutInvalid) {
        BVar4 = IR::operator&((BailOutKind)labelSkipBailOut,BailOutOnMissingValue);
        if (BVar4 != BailOutInvalid) {
          LowerBailOnCreatedMissingValue(this,pIStack_20,(bool)(local_25 & 1));
          IR::operator^=((BailOutKind *)&labelSkipBailOut,BailOutOnMissingValue);
          bVar2 = IR::operator!((BailOutKind)labelSkipBailOut);
          if ((!bVar2) &&
             (BVar4 = IR::Instr::GetBailOutKind(pIStack_20), BVar4 != (BailOutKind)labelSkipBailOut)
             ) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x23c6,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                               "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
        }
      }
      else {
        BVar4 = IR::operator&((BailOutKind)labelSkipBailOut,BailOutOnMissingValue);
        bVar2 = IR::operator!(BVar4);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x23bd,"(!(bailOutKind & IR::BailOutOnMissingValue))",
                             "!(bailOutKind & IR::BailOutOnMissingValue)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        LowerBailOnInvalidatedArrayHeadSegment(this,pIStack_20,(bool)(local_25 & 1));
        IR::operator^=((BailOutKind *)&labelSkipBailOut,BailOutOnInvalidatedArrayHeadSegment);
        bVar2 = IR::operator!((BailOutKind)labelSkipBailOut);
        if ((!bVar2) &&
           (BVar4 = IR::Instr::GetBailOutKind(pIStack_20), BVar4 != (BailOutKind)labelSkipBailOut))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x23c0,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                             "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
      BVar4 = IR::operator&((BailOutKind)labelSkipBailOut,BailOutOnInvalidatedArrayLength);
      if (BVar4 != BailOutInvalid) {
        LowerBailOnInvalidatedArrayLength(this,pIStack_20,(bool)(local_25 & 1));
        IR::operator^=((BailOutKind *)&labelSkipBailOut,BailOutOnInvalidatedArrayLength);
        bVar2 = IR::operator!((BailOutKind)labelSkipBailOut);
        if ((!bVar2) &&
           (BVar4 = IR::Instr::GetBailOutKind(pIStack_20), BVar4 != (BailOutKind)labelSkipBailOut))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x23cc,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                             "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
      BVar4 = IR::operator&((BailOutKind)labelSkipBailOut,BailOutConvertedNativeArray);
      if (BVar4 != BailOutInvalid) {
        target = IR::LabelInstr::New(Label,this->m_func,(bool)(local_25 & 1));
        IR::Instr::InsertAfter(pIStack_20,&target->super_Instr);
        LowerOneBailOutKind(this,pIStack_20,BailOutConvertedNativeArray,(bool)(local_25 & 1),false);
        _bailOutKind = IR::RegOpnd::New(TyInt64,this->m_func);
        InsertTestBranch(&_bailOutKind->super_Opnd,&_bailOutKind->super_Opnd,BrEq_A,target,
                         pIStack_20->m_next);
      }
    }
    IR::Instr::UnlinkDst(pIStack_20);
    IR::Instr::UnlinkSrc1(pIStack_20);
    if ((((instrPrev._4_4_ != HelperOP_InitElemGetter) &&
         (instrPrev._4_4_ != HelperOP_InitElemSetter)) &&
        (instrPrev._4_4_ != HelperOP_InitComputedProperty)) &&
       (((instrPrev._4_4_ != HelperOp_SetElementI &&
         (instrPrev._4_4_ != HelperOp_InitClassMemberComputedName)) &&
        ((instrPrev._4_4_ != HelperOp_InitClassMemberGetComputedName &&
         (instrPrev._4_4_ != HelperOp_InitClassMemberSetComputedName)))))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x23e3,
                         "(helperMethod == IR::HelperOP_InitElemGetter || helperMethod == IR::HelperOP_InitElemSetter || helperMethod == IR::HelperOP_InitComputedProperty || helperMethod == IR::HelperOp_SetElementI || helperMethod == IR::HelperOp_InitClassMemberComputedName || helperMethod == IR::HelperOp_InitClassMemberGetComputedName || helperMethod == IR::HelperOp_InitClassMemberSetComputedName)"
                         ,
                         "helperMethod == IR::HelperOP_InitElemGetter || helperMethod == IR::HelperOP_InitElemSetter || helperMethod == IR::HelperOP_InitComputedProperty || helperMethod == IR::HelperOp_SetElementI || helperMethod == IR::HelperOp_InitClassMemberComputedName || helperMethod == IR::HelperOp_InitClassMemberGetComputedName || helperMethod == IR::HelperOp_InitClassMemberSetComputedName"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pIVar7 = IR::Opnd::AsIndirOpnd(newDst);
    offset = (IntConstType)IR::IndirOpnd::UnlinkIndexOpnd(pIVar7);
    if (((RegOpnd *)offset == (RegOpnd *)0x0) ||
       (IVar3 = IR::Opnd::GetType((Opnd *)offset), IVar3 == TyVar)) {
      if ((RegOpnd *)offset == (RegOpnd *)0x0) {
        pIVar7 = IR::Opnd::AsIndirOpnd(newDst);
        iVar5 = IR::IndirOpnd::GetOffset(pIVar7);
        offset = (IntConstType)IR::AddrOpnd::NewFromNumber((long)iVar5,this->m_func,false);
      }
      if (labelSkipBailOut._7_1_ != TyVar) {
        if (labelSkipBailOut._7_1_ == TyInt32) {
          local_9c = HelperOp_SetNativeIntElementI_NoConvert;
          if ((labelSkipBailOut._6_1_ & 1) != 0) {
            local_9c = HelperOp_SetNativeIntElementI;
          }
        }
        else {
          local_9c = HelperOp_SetNativeFloatElementI_NoConvert;
          if ((labelSkipBailOut._6_1_ & 1) != 0) {
            local_9c = HelperOp_SetNativeFloatElementI;
          }
        }
        instrPrev._4_4_ = local_9c;
      }
    }
    else {
      if ((((instrPrev._4_4_ == HelperOP_InitElemGetter) ||
           (instrPrev._4_4_ == HelperOP_InitElemSetter)) ||
          (instrPrev._4_4_ == HelperOp_InitClassMemberGetComputedName)) ||
         (instrPrev._4_4_ == HelperOp_InitClassMemberSetComputedName)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x23f0,
                           "(helperMethod != IR::HelperOP_InitElemGetter && helperMethod != IR::HelperOP_InitElemSetter && helperMethod != IR::HelperOp_InitClassMemberGetComputedName && helperMethod != IR::HelperOp_InitClassMemberSetComputedName)"
                           ,
                           "helperMethod != IR::HelperOP_InitElemGetter && helperMethod != IR::HelperOP_InitElemSetter && helperMethod != IR::HelperOp_InitClassMemberGetComputedName && helperMethod != IR::HelperOp_InitClassMemberSetComputedName"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      IVar3 = IR::Opnd::GetType((Opnd *)offset);
      if (IVar3 == TyInt32) {
        if (labelSkipBailOut._7_1_ == TyVar) {
          local_8c = HelperOp_SetElementI_Int32;
        }
        else {
          if (labelSkipBailOut._7_1_ == TyInt32) {
            local_90 = HelperOp_SetNativeIntElementI_Int32_NoConvert;
            if ((labelSkipBailOut._6_1_ & 1) != 0) {
              local_90 = HelperOp_SetNativeIntElementI_Int32;
            }
          }
          else {
            local_90 = HelperOp_SetNativeFloatElementI_Int32_NoConvert;
            if ((labelSkipBailOut._6_1_ & 1) != 0) {
              local_90 = HelperOp_SetNativeFloatElementI_Int32;
            }
          }
          local_8c = local_90;
        }
        instrPrev._4_4_ = local_8c;
      }
      else {
        IVar3 = IR::Opnd::GetType((Opnd *)offset);
        if (IVar3 == TyUint32) {
          if (labelSkipBailOut._7_1_ == TyVar) {
            local_94 = HelperOp_SetElementI_UInt32;
          }
          else {
            if (labelSkipBailOut._7_1_ == TyInt32) {
              local_98 = HelperOp_SetNativeIntElementI_UInt32_NoConvert;
              if ((labelSkipBailOut._6_1_ & 1) != 0) {
                local_98 = HelperOp_SetNativeIntElementI_UInt32;
              }
            }
            else {
              local_98 = HelperOp_SetNativeFloatElementI_UInt32_NoConvert;
              if ((labelSkipBailOut._6_1_ & 1) != 0) {
                local_98 = HelperOp_SetNativeFloatElementI_UInt32;
              }
            }
            local_94 = local_98;
          }
          instrPrev._4_4_ = local_94;
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2404,"(0)","FALSE");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    if (labelSkipBailOut._7_1_ == TyFloat64) {
      LowererMD::LoadDoubleHelperArgument(&this->m_lowererMD,pIStack_20,dst);
    }
    instr_00 = pIStack_20;
    opndArg = IR::IntConstOpnd::New((long)(int)helperMethod_local,TyInt32,this->m_func,true);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr_00,&opndArg->super_Opnd);
    LoadScriptContext(this,pIStack_20);
    if (labelSkipBailOut._7_1_ != TyFloat64) {
      LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_20,dst);
    }
    LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_20,(Opnd *)offset);
    pIVar7 = IR::Opnd::AsIndirOpnd(newDst);
    opndArg_00 = IR::IndirOpnd::UnlinkBaseOpnd(pIVar7);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_20,&opndArg_00->super_Opnd);
    IR::Opnd::Free(newDst,this->m_func);
    if (_bailOutKind != (RegOpnd *)0x0) {
      IR::Instr::SetDst(pIStack_20,&_bailOutKind->super_Opnd);
    }
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,pIStack_20,instrPrev._4_4_,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,(bool)(local_25 & 1));
    this_local = (Lowerer *)src1;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Lowerer::LowerStElemI(IR::Instr * instr, Js::PropertyOperationFlags flags, bool isHelper, IR::JnHelperMethod helperMethod)
{
    IR::Instr *instrPrev = instr->m_prev;

    if (instr->IsJitProfilingInstr())
    {
        Assert(!isHelper);
        LowerProfiledStElemI(instr->AsJitProfilingInstr(), flags);
        return instrPrev;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *dst = instr->GetDst();
    IR::Opnd *newDst = nullptr;
    IRType srcType = src1->GetType();

    AssertMsg(dst->IsIndirOpnd(), "Expected indirOpnd on StElementI");

    bool allowConvert = dst->AsIndirOpnd()->ConversionAllowed();

#if !FLOATVAR
    if (dst->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyOptimizedTypedArray() && src1->IsRegOpnd())
    {
        // We allow the source of typedArray StElem to be marked as temp, since we just need the value,
        // however if the array turns out to be a non-typed array, or the index isn't valid (the value is then stored as a property)
        // the temp needs to be boxed if it is a float.  The BoxStackNumber helper will box JavascriptNumbers
        // which are on the stack.

        // regVar = BoxStackNumber(src1, scriptContext)
        IR::Instr *newInstr = IR::Instr::New(Js::OpCode::Call, this->m_func);
        IR::RegOpnd *regVar = IR::RegOpnd::New(TyVar, this->m_func);
        newInstr->SetDst(regVar);
        newInstr->SetSrc1(src1);
        instr->InsertBefore(newInstr);
        LowerUnaryHelperMem(newInstr, IR::HelperBoxStackNumber);

        // MOV src1, regVar
        newInstr = IR::Instr::New(Js::OpCode::Ld_A, src1, regVar, this->m_func);
        instr->InsertBefore(m_lowererMD.ChangeToAssign(newInstr));
    }
#endif

    if(instr->HasBailOutInfo())
    {
        IR::BailOutKind bailOutKind = instr->GetBailOutKind();
        if(bailOutKind & IR::BailOutOnInvalidatedArrayHeadSegment)
        {
            Assert(!(bailOutKind & IR::BailOutOnMissingValue));
            LowerBailOnInvalidatedArrayHeadSegment(instr, isHelper);
            bailOutKind ^= IR::BailOutOnInvalidatedArrayHeadSegment;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        else if(bailOutKind & IR::BailOutOnMissingValue)
        {
            LowerBailOnCreatedMissingValue(instr, isHelper);
            bailOutKind ^= IR::BailOutOnMissingValue;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        if(bailOutKind & IR::BailOutOnInvalidatedArrayLength)
        {
            LowerBailOnInvalidatedArrayLength(instr, isHelper);
            bailOutKind ^= IR::BailOutOnInvalidatedArrayLength;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        if(bailOutKind & IR::BailOutConvertedNativeArray)
        {
            IR::LabelInstr *labelSkipBailOut = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
            instr->InsertAfter(labelSkipBailOut);
            LowerOneBailOutKind(instr, IR::BailOutConvertedNativeArray, isHelper);
            newDst = IR::RegOpnd::New(TyMachReg, m_func);
            InsertTestBranch(newDst, newDst, Js::OpCode::BrEq_A, labelSkipBailOut, instr->m_next);
        }
    }

    instr->UnlinkDst();
    instr->UnlinkSrc1();

    Assert(
        helperMethod == IR::HelperOP_InitElemGetter ||
        helperMethod == IR::HelperOP_InitElemSetter ||
        helperMethod == IR::HelperOP_InitComputedProperty ||
        helperMethod == IR::HelperOp_SetElementI ||
        helperMethod == IR::HelperOp_InitClassMemberComputedName ||
        helperMethod == IR::HelperOp_InitClassMemberGetComputedName ||
        helperMethod == IR::HelperOp_InitClassMemberSetComputedName
        );

    IR::IndirOpnd* dstIndirOpnd = dst->AsIndirOpnd();

    IR::Opnd *indexOpnd = dstIndirOpnd->UnlinkIndexOpnd();

    if (indexOpnd && indexOpnd->GetType() != TyVar)
    {
        Assert(
            helperMethod != IR::HelperOP_InitElemGetter &&
            helperMethod != IR::HelperOP_InitElemSetter &&
            helperMethod != IR::HelperOp_InitClassMemberGetComputedName &&
            helperMethod != IR::HelperOp_InitClassMemberSetComputedName
        );

        if (indexOpnd->GetType() == TyInt32)
        {
            helperMethod =
                srcType == TyVar ? IR::HelperOp_SetElementI_Int32 :
                srcType == TyInt32 ? 
                    (allowConvert ? IR::HelperOp_SetNativeIntElementI_Int32 : IR::HelperOp_SetNativeIntElementI_Int32_NoConvert) :
                    (allowConvert ? IR::HelperOp_SetNativeFloatElementI_Int32 : IR::HelperOp_SetNativeFloatElementI_Int32_NoConvert) ;
        }
        else if (indexOpnd->GetType() == TyUint32)
        {
            helperMethod =
                srcType == TyVar ? IR::HelperOp_SetElementI_UInt32 :
                srcType == TyInt32 ? 
                    (allowConvert ? IR::HelperOp_SetNativeIntElementI_UInt32 : IR::HelperOp_SetNativeIntElementI_UInt32_NoConvert) :
                    (allowConvert ? IR::HelperOp_SetNativeFloatElementI_UInt32 : IR::HelperOp_SetNativeFloatElementI_UInt32_NoConvert) ;
        }
        else
        {
            Assert(FALSE);
        }
    }
    else
    {
        if (indexOpnd == nullptr)
        {
            // No index; the offset identifies the element.
            IntConstType offset = (IntConstType)dst->AsIndirOpnd()->GetOffset();
            indexOpnd = IR::AddrOpnd::NewFromNumber(offset, m_func);
        }

        if (srcType != TyVar)
        {
            helperMethod = srcType == TyInt32 ? 
                (allowConvert ? IR::HelperOp_SetNativeIntElementI : IR::HelperOp_SetNativeIntElementI_NoConvert) : 
                (allowConvert ? IR::HelperOp_SetNativeFloatElementI : IR::HelperOp_SetNativeFloatElementI_NoConvert);
        }
    }

    if (srcType == TyFloat64)
    {
        m_lowererMD.LoadDoubleHelperArgument(instr, src1);
    }
    m_lowererMD.LoadHelperArgument(instr,
        IR::IntConstOpnd::New(static_cast<IntConstType>(flags), IRType::TyInt32, m_func, true));
    LoadScriptContext(instr);
    if (srcType != TyFloat64)
    {
        m_lowererMD.LoadHelperArgument(instr, src1);
    }
    m_lowererMD.LoadHelperArgument(instr, indexOpnd);

    IR::Opnd *baseOpnd = dst->AsIndirOpnd()->UnlinkBaseOpnd();
    m_lowererMD.LoadHelperArgument(instr, baseOpnd);

    dst->Free(this->m_func);
    if (newDst)
    {
        instr->SetDst(newDst);
    }

    m_lowererMD.ChangeToHelperCall(instr, helperMethod, nullptr, nullptr, nullptr, isHelper);

    return instrPrev;
}